

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O3

void __thiscall
CUIRect::Draw4(CUIRect *this,vec4 *ColorTopLeft,vec4 *ColorTopRight,vec4 *ColorBottomLeft,
              vec4 *ColorBottomRight,float Rounding,int Corners)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  char cVar19;
  uint uVar20;
  long in_FS_OFFSET;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  CQuadItem ItemQ;
  undefined8 local_58;
  undefined8 local_50;
  float fStack_48;
  float fStack_44;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x13])(s_pGraphics,0xffffffff);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  auVar31._0_4_ = -(uint)((Corners & 8U) == 0);
  auVar31._4_4_ = -(uint)((Corners & 4U) == 0);
  auVar31._8_4_ = -(uint)((Corners & 2U) == 0);
  auVar31._12_4_ = -(uint)((Corners & 1U) == 0);
  auVar30._0_4_ = -(uint)((Corners & 0x80U) == 0);
  auVar30._4_4_ = -(uint)((Corners & 0x40U) == 0);
  auVar30._8_4_ = -(uint)((Corners & 0x20U) == 0);
  auVar30._12_4_ = -(uint)((Corners & 0x10U) == 0);
  auVar31 = packssdw(auVar30,auVar31);
  auVar31 = packsswb(auVar31,auVar31);
  cVar19 = SUB161(auVar31 >> 0x3f,0) << 7;
  uVar20 = 0;
  do {
    fVar27 = (float)(int)(uVar20 + 1) / 5.092958;
    fVar28 = (float)(int)(uVar20 + 2) / 5.092958;
    fVar22 = cosf((float)(int)uVar20 / 5.092958);
    fVar23 = cosf(fVar27);
    fVar24 = cosf(fVar28);
    fVar25 = sinf((float)(int)uVar20 / 5.092958);
    fVar27 = sinf(fVar27);
    fVar28 = sinf(fVar28);
    if (cVar19 == '\0') {
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      uVar1 = this->x;
      uVar10 = this->y;
      local_40 = CONCAT44((1.0 - fVar27) * Rounding + (float)uVar10,
                          (1.0 - fVar23) * Rounding + (float)uVar1);
      local_58 = CONCAT44((float)uVar10 + Rounding,(float)uVar1 + Rounding);
      fStack_48 = (1.0 - fVar24) * Rounding + (float)uVar1;
      fStack_44 = (1.0 - fVar28) * Rounding + (float)uVar10;
      local_50 = CONCAT44((1.0 - fVar25) * Rounding + (float)uVar10,
                          (1.0 - fVar22) * Rounding + (float)uVar1);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_58,1);
    }
    if ((auVar31 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      fVar29 = this->y;
      fVar26 = (this->x + this->w) - Rounding;
      local_58 = CONCAT44(fVar29 + Rounding,fVar26);
      local_40 = CONCAT44((1.0 - fVar27) * Rounding + fVar29,fVar23 * Rounding + fVar26);
      fStack_48 = fVar24 * Rounding + fVar26;
      fStack_44 = (1.0 - fVar28) * Rounding + fVar29;
      local_50 = CONCAT44((1.0 - fVar25) * Rounding + fVar29,fVar22 * Rounding + fVar26);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_58,1);
    }
    if ((auVar31 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      fVar29 = this->x;
      fVar26 = (this->y + this->h) - Rounding;
      local_58 = CONCAT44(fVar26,fVar29 + Rounding);
      fStack_48 = (1.0 - fVar24) * Rounding + fVar29;
      fStack_44 = fVar28 * Rounding + fVar26;
      local_50 = CONCAT44(fVar25 * Rounding + fVar26,(1.0 - fVar22) * Rounding + fVar29);
      local_40 = CONCAT44(fVar27 * Rounding + fVar26,(1.0 - fVar23) * Rounding + fVar29);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_58,1);
    }
    if ((auVar31 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      uVar2 = this->x;
      uVar11 = this->y;
      uVar3 = this->w;
      uVar12 = this->h;
      fVar29 = ((float)uVar3 + (float)uVar2) - Rounding;
      fVar26 = ((float)uVar12 + (float)uVar11) - Rounding;
      local_58 = CONCAT44(fVar26,fVar29);
      local_40 = CONCAT44(fVar27 * Rounding + fVar26,fVar23 * Rounding + fVar29);
      fStack_48 = fVar24 * Rounding + fVar29;
      fStack_44 = fVar28 * Rounding + fVar26;
      local_50 = CONCAT44(fVar25 * Rounding + fVar26,fVar22 * Rounding + fVar29);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_58,1);
    }
    if ((auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      local_58._0_4_ = this->x;
      local_58._4_4_ = this->y;
      fVar29 = (float)local_58._4_4_ - Rounding;
      fStack_48 = (1.0 - fVar24) * Rounding + (float)(undefined4)local_58;
      fStack_44 = fVar28 * Rounding + fVar29;
      local_50 = CONCAT44(fVar25 * Rounding + fVar29,
                          (1.0 - fVar22) * Rounding + (float)(undefined4)local_58);
      local_40 = CONCAT44(fVar27 * Rounding + fVar29,
                          (1.0 - fVar23) * Rounding + (float)(undefined4)local_58);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_58,1);
    }
    if ((auVar31 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      fVar29 = this->x + this->w;
      local_58 = CONCAT44(this->y,fVar29);
      fVar29 = fVar29 - Rounding;
      fVar26 = this->y - Rounding;
      local_40 = CONCAT44(fVar27 * Rounding + fVar26,fVar23 * Rounding + fVar29);
      fStack_48 = fVar24 * Rounding + fVar29;
      fStack_44 = fVar28 * Rounding + fVar26;
      local_50 = CONCAT44(fVar25 * Rounding + fVar26,fVar22 * Rounding + fVar29);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_58,1);
    }
    if ((auVar31 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      fVar29 = this->x;
      fVar26 = this->y + this->h;
      local_58 = CONCAT44(fVar26,fVar29);
      fStack_48 = (1.0 - fVar24) * Rounding + fVar29;
      fStack_44 = (1.0 - fVar28) * Rounding + fVar26;
      local_50 = CONCAT44((1.0 - fVar25) * Rounding + fVar26,(1.0 - fVar22) * Rounding + fVar29);
      local_40 = CONCAT44((1.0 - fVar27) * Rounding + fVar26,(1.0 - fVar23) * Rounding + fVar29);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_58,1);
    }
    if ((auVar31 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      uVar4 = this->x;
      uVar13 = this->y;
      uVar5 = this->w;
      uVar14 = this->h;
      fVar29 = (float)uVar5 + (float)uVar4;
      fVar26 = (float)uVar14 + (float)uVar13;
      local_58 = CONCAT44(fVar26,fVar29);
      fStack_48 = fVar24 * Rounding + (fVar29 - Rounding);
      fStack_44 = (1.0 - fVar28) * Rounding + fVar26;
      local_50 = CONCAT44((1.0 - fVar25) * Rounding + fVar26,fVar22 * Rounding + (fVar29 - Rounding)
                         );
      local_40 = CONCAT44((1.0 - fVar27) * Rounding + fVar26,fVar23 * Rounding + (fVar29 - Rounding)
                         );
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_58,1);
    }
    bVar21 = uVar20 < 6;
    uVar20 = uVar20 + 2;
  } while (bVar21);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorTopLeft,ColorTopRight,ColorBottomLeft,ColorBottomRight);
  fVar22 = -Rounding;
  uVar6 = this->x;
  uVar15 = this->y;
  local_58 = CONCAT44((float)uVar15 + Rounding,(float)uVar6 + Rounding);
  uVar7 = this->w;
  uVar16 = this->h;
  local_50 = CONCAT44((float)uVar16 - (Rounding + Rounding),(float)uVar7 - (Rounding + Rounding));
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_58,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorTopLeft,ColorTopRight,ColorTopLeft,ColorTopRight);
  fVar23 = fVar22 - Rounding;
  local_58 = CONCAT44(this->y,this->x + Rounding);
  local_50 = CONCAT44(Rounding,this->w + fVar23);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_58,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorBottomLeft,ColorBottomRight,ColorBottomLeft,ColorBottomRight);
  local_58 = CONCAT44((this->y + this->h) - Rounding,this->x + Rounding);
  local_50 = CONCAT44(Rounding,this->w + fVar23);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_58,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorTopLeft,ColorTopLeft,ColorBottomLeft,ColorBottomLeft);
  local_58 = CONCAT44(this->y + Rounding,this->x);
  local_50 = CONCAT44(this->h + fVar23,Rounding);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_58,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorTopRight,ColorTopRight,ColorBottomRight,ColorBottomRight);
  local_58 = CONCAT44(this->y + Rounding,(this->x + this->w) - Rounding);
  local_50 = CONCAT44(fVar23 + this->h,Rounding);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_58,1);
  if (cVar19 != '\0') {
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    local_58._0_4_ = this->x;
    local_58._4_4_ = this->y;
    local_50 = CONCAT44(Rounding,Rounding);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_58,1);
  }
  if ((auVar31 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    local_58 = CONCAT44(this->y,this->x + this->w);
    local_50 = CONCAT44(Rounding,fVar22);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_58,1);
  }
  if ((auVar31 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    local_58 = CONCAT44(this->y + this->h,this->x);
    local_50 = CONCAT44(fVar22,Rounding);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_58,1);
  }
  if ((auVar31 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    uVar8 = this->x;
    uVar17 = this->y;
    uVar9 = this->w;
    uVar18 = this->h;
    local_58 = CONCAT44((float)uVar18 + (float)uVar17,(float)uVar9 + (float)uVar8);
    local_50 = CONCAT44(fVar22,fVar22);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_58,1);
  }
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUIRect::Draw4(const vec4 &ColorTopLeft, const vec4 &ColorTopRight, const vec4 &ColorBottomLeft, const vec4 &ColorBottomRight, float Rounding, int Corners) const
{
	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();

	const float r = Rounding;

	for(int i = 0; i < NUM_ROUND_CORNER_SEGMENTS; i+=2)
	{
		float a1 = i/s_CornerAnglePerSegment;
		float a2 = (i+1)/s_CornerAnglePerSegment;
		float a3 = (i+2)/s_CornerAnglePerSegment;
		float Ca1 = cosf(a1);
		float Ca2 = cosf(a2);
		float Ca3 = cosf(a3);
		float Sa1 = sinf(a1);
		float Sa2 = sinf(a2);
		float Sa3 = sinf(a3);

		if(Corners&CORNER_TL)
		{
			s_pGraphics->SetColor(ColorTopLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+r, y+r,
				x+(1-Ca1)*r, y+(1-Sa1)*r,
				x+(1-Ca3)*r, y+(1-Sa3)*r,
				x+(1-Ca2)*r, y+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_TR)
		{
			s_pGraphics->SetColor(ColorTopRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w-r, y+r,
				x+w-r+Ca1*r, y+(1-Sa1)*r,
				x+w-r+Ca3*r, y+(1-Sa3)*r,
				x+w-r+Ca2*r, y+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_BL)
		{
			s_pGraphics->SetColor(ColorBottomLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+r, y+h-r,
				x+(1-Ca1)*r, y+h-r+Sa1*r,
				x+(1-Ca3)*r, y+h-r+Sa3*r,
				x+(1-Ca2)*r, y+h-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_BR)
		{
			s_pGraphics->SetColor(ColorBottomRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w-r, y+h-r,
				x+w-r+Ca1*r, y+h-r+Sa1*r,
				x+w-r+Ca3*r, y+h-r+Sa3*r,
				x+w-r+Ca2*r, y+h-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_ITL)
		{
			s_pGraphics->SetColor(ColorTopLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x, y,
				x+(1-Ca1)*r, y-r+Sa1*r,
				x+(1-Ca3)*r, y-r+Sa3*r,
				x+(1-Ca2)*r, y-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_ITR)
		{
			s_pGraphics->SetColor(ColorTopRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w, y,
				x+w-r+Ca1*r, y-r+Sa1*r,
				x+w-r+Ca3*r, y-r+Sa3*r,
				x+w-r+Ca2*r, y-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_IBL)
		{
			s_pGraphics->SetColor(ColorBottomLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x, y+h,
				x+(1-Ca1)*r, y+h+(1-Sa1)*r,
				x+(1-Ca3)*r, y+h+(1-Sa3)*r,
				x+(1-Ca2)*r, y+h+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_IBR)
		{
			s_pGraphics->SetColor(ColorBottomRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w, y+h,
				x+w-r+Ca1*r, y+h+(1-Sa1)*r,
				x+w-r+Ca3*r, y+h+(1-Sa3)*r,
				x+w-r+Ca2*r, y+h+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}
	}

	// center
	{
		s_pGraphics->SetColor4(ColorTopLeft, ColorTopRight, ColorBottomLeft, ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+r, y+r, w-r*2, h-r*2);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// top
	{
		s_pGraphics->SetColor4(ColorTopLeft, ColorTopRight, ColorTopLeft, ColorTopRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+r, y, w-r*2, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// bottom
	{
		s_pGraphics->SetColor4(ColorBottomLeft, ColorBottomRight, ColorBottomLeft, ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+r, y+h-r, w-r*2, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// left
	{
		s_pGraphics->SetColor4(ColorTopLeft, ColorTopLeft, ColorBottomLeft, ColorBottomLeft);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x, y+r, r, h-r*2);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// right
	{
		s_pGraphics->SetColor4(ColorTopRight, ColorTopRight, ColorBottomRight, ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+w-r, y+r, r, h-r*2);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_TL))
	{
		s_pGraphics->SetColor(ColorTopLeft);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x, y, r, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_TR))
	{
		s_pGraphics->SetColor(ColorTopRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+w, y, -r, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_BL))
	{
		s_pGraphics->SetColor(ColorBottomLeft);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x, y+h, r, -r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_BR))
	{
		s_pGraphics->SetColor(ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+w, y+h, -r, -r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	s_pGraphics->QuadsEnd();
}